

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_uuencode.c
# Opt level: O3

void test_write_filter_uuencode(void)

{
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  archive *paVar4;
  char *pcVar5;
  archive_entry *entry;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  uint uVar8;
  ulong uVar9;
  archive_entry *ae;
  size_t used2;
  char path [16];
  size_t used1;
  archive_entry *local_68;
  void *local_60;
  void *local_58;
  size_t local_50;
  char local_48 [16];
  size_t local_38;
  
  pvVar3 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L',',(uint)(pvVar3 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  local_58 = calloc(1,10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'/',(uint)(local_58 != (void *)0x0),"NULL != (data = malloc(datasize))",
                   (void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'5',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'6',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_uuencode(a)",paVar4
                     );
  iVar1 = archive_write_set_bytes_per_block(paVar4,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",
                      paVar4);
  iVar1 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L':',7,"ARCHIVE_FILTER_UU",(long)iVar1,"archive_filter_code(a, 0)",
                      (void *)0x0);
  pcVar5 = archive_filter_name(paVar4,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
             ,L';',"uuencode","\"uuencode\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  local_60 = pvVar3;
  iVar1 = archive_write_open_memory(paVar4,pvVar3,2000000,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
  uVar9 = 0;
  do {
    entry = archive_entry_new();
    local_68 = entry;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'?',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_filetype(entry,0x8000);
    archive_entry_set_size(entry,10000);
    snprintf(local_48,0x10,"file%03d",uVar9);
    archive_entry_copy_pathname(entry,local_48);
    iVar1 = archive_write_header(paVar4,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
    lVar6 = archive_write_data(paVar4,local_58,10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'F',(uint)(lVar6 == 10000),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
    archive_entry_free(entry);
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
  } while (uVar8 != 99);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'L',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_open_memory(paVar4,local_60,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used1)",
                      paVar4);
  uVar9 = 0;
  do {
    snprintf(local_48,0x10,"file%03d",uVar9);
    iVar1 = archive_read_next_header(paVar4,&local_68);
    wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                                ,L'R',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
    if (wVar2 == L'\0') break;
    pcVar5 = archive_entry_pathname(local_68);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
               ,L'T',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar7 = archive_entry_size(local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'U',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",(void *)0x0);
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
  } while (uVar8 != 99);
  iVar1 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'W',7,"ARCHIVE_FILTER_UU",(long)iVar1,"archive_filter_code(a, 0)",
                      (void *)0x0);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'_',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_set_bytes_per_block(paVar4,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",
                      paVar4);
  iVar1 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_uuencode(a)",paVar4
                     );
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"nonexistent-option","0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'e',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"nonexistent-option\", \"0\")",
                      paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","abc");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'g',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")",
                      paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","99");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'i',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")",
                      paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"name","test.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'k',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"name\", \"test.tar\")",paVar4);
  iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"mode","0640");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_filter_option(a, NULL, \"mode\", \"0640\")",paVar4);
  iVar1 = archive_write_open_memory(paVar4,local_60,2000000,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'o',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  pvVar3 = local_58;
  uVar9 = 0;
  do {
    snprintf(local_48,0x10,"file%03d",uVar9);
    local_68 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'r',(uint)(local_68 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(local_68,local_48);
    archive_entry_set_size(local_68,10000);
    archive_entry_set_filetype(local_68,0x8000);
    iVar1 = archive_write_header(paVar4,local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
    lVar6 = archive_write_data(paVar4,pvVar3,10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'w',(uint)(lVar6 == 10000),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
    archive_entry_free(local_68);
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
  } while (uVar8 != 99);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'}',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x7f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      paVar4);
  iVar1 = archive_read_open_memory(paVar4,local_60,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x80',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used2)"
                      ,paVar4);
  uVar9 = 0;
  do {
    snprintf(local_48,0x10,"file%03d",uVar9);
    iVar1 = archive_read_next_header(paVar4,&local_68);
    wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                                ,L'\x83',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",
                                (void *)0x0);
    if (wVar2 == L'\0') break;
    pcVar5 = archive_entry_pathname(local_68);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
               ,L'\x85',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar7 = archive_entry_size(local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'\x86',10000,"(int)datasize",lVar7,"archive_entry_size(ae)",(void *)0x0);
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
  } while (uVar8 != 99);
  iVar1 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x88',7,"ARCHIVE_FILTER_UU",(long)iVar1,"archive_filter_code(a, 0)",
                      (void *)0x0);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x89',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x8a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x90',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x91',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x94',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x96',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x99',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4
                     );
  iVar1 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9d',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x9f',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\xa0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar4
                     );
  iVar1 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'¡',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  pvVar3 = local_60;
  iVar1 = archive_write_open_memory(paVar4,local_60,2000000,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'¤',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'¥',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  free(local_58);
  free(pvVar3);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_uuencode)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_UU, archive_filter_code(a, 0));
	assertEqualString("uuencode", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	for (i = 0; i < 99; i++) {
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_filetype(ae, AE_IFREG);
		archive_entry_set_size(ae, datasize);
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used1));
	for (i = 0; i < 99; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		if (!assertEqualIntA(a, 0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualInt(ARCHIVE_FILTER_UU, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting name and mode
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "name", "test.tar"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "mode", "0640"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 99; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used2));
	for (i = 0; i < 99; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualInt(ARCHIVE_FILTER_UU, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}